

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int unqlitePagerCommit(Pager *pPager)

{
  int local_1c;
  int rc;
  Pager *pPager_local;
  
  local_1c = pager_commit_phase1(pPager);
  if ((local_1c == 0) && (local_1c = pager_commit_phase2(pPager), local_1c == 0)) {
    pPager->iFlags = pPager->iFlags & 0xfffffffe;
    pPager_local._4_4_ = 0;
  }
  else {
    pPager->pDb->iFlags = pPager->pDb->iFlags | 1;
    pPager_local._4_4_ = local_1c;
  }
  return pPager_local._4_4_;
}

Assistant:

UNQLITE_PRIVATE int unqlitePagerCommit(Pager *pPager)
{
	int rc;
	/* Commit: Phase One */
	rc = pager_commit_phase1(pPager);
	if( rc != UNQLITE_OK ){
		goto fail;
	}
	/* Commit: Phase Two */
	rc = pager_commit_phase2(pPager);
	if( rc != UNQLITE_OK ){
		goto fail;
	}
	/* Remove stale flags */
	pPager->iFlags &= ~PAGER_CTRL_COMMIT_ERR;
	/* All done */
	return UNQLITE_OK;
fail:
	/* Disable the auto-commit flag */
	pPager->pDb->iFlags |= UNQLITE_FL_DISABLE_AUTO_COMMIT;
	return rc;
}